

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_is_subset_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ushort uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  bool bVar18;
  
  lVar6 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar6 + 4) & 0x20) == 0) {
    iVar4 = container1->n_runs;
    lVar6 = (long)iVar4;
    if (0 < lVar6) {
      lVar11 = 0;
      do {
        iVar4 = iVar4 + (uint)container1->runs[lVar11].length;
        lVar11 = lVar11 + 1;
      } while (lVar6 != lVar11);
    }
  }
  else {
    iVar4 = _avx2_run_container_cardinality(container1);
  }
  iVar2 = container2->cardinality;
  if (iVar2 < iVar4) {
LAB_0010ea2e:
    bVar18 = false;
  }
  else {
    uVar7 = (ulong)container1->n_runs;
    bVar18 = (long)uVar7 < 1;
    if (0 < (long)uVar7) {
      puVar3 = container2->array;
      iVar4 = iVar2 + -1;
      iVar8 = -1;
      uVar12 = 0;
      do {
        uVar1 = container1->runs[uVar12].value;
        iVar5 = iVar8 + 1;
        iVar9 = iVar5;
        if ((iVar5 < iVar2) && (puVar3[iVar5] < uVar1)) {
          iVar9 = iVar8 + 2;
          iVar15 = 0;
          iVar17 = iVar4;
          if (iVar9 < iVar2) {
            iVar10 = 1;
            do {
              iVar15 = iVar10;
              iVar17 = iVar9;
              if (uVar1 <= puVar3[iVar9]) break;
              iVar15 = iVar10 * 2;
              iVar9 = iVar5 + iVar10 * 2;
              iVar10 = iVar15;
              iVar17 = iVar4;
            } while (iVar9 < iVar2);
            iVar15 = iVar15 >> 1;
          }
          iVar9 = iVar17;
          if (((puVar3[iVar17] != uVar1) && (iVar9 = iVar2, uVar1 <= puVar3[iVar17])) &&
             (iVar9 = iVar17, iVar15 + iVar5 + 1 != iVar17)) {
            iVar15 = iVar15 + iVar5;
            do {
              iVar9 = iVar15 + iVar17 >> 1;
              if (puVar3[iVar9] == uVar1) break;
              iVar10 = iVar9;
              if (puVar3[iVar9] < uVar1) {
                iVar10 = iVar17;
                iVar15 = iVar9;
              }
              iVar9 = iVar10;
              iVar17 = iVar10;
            } while (iVar15 + 1 != iVar10);
          }
        }
        uVar16 = (uint)container1->runs[uVar12].length;
        uVar14 = uVar1 + uVar16;
        iVar15 = iVar5;
        if ((iVar5 < iVar2) && (uVar13 = (ushort)uVar14, puVar3[iVar5] < uVar13)) {
          iVar8 = iVar8 + 2;
          iVar17 = 0;
          iVar10 = iVar4;
          if (iVar8 < iVar2) {
            iVar15 = 1;
            do {
              iVar10 = iVar8;
              iVar17 = iVar15;
              if (uVar13 <= puVar3[iVar8]) break;
              iVar17 = iVar15 * 2;
              iVar8 = iVar5 + iVar15 * 2;
              iVar10 = iVar4;
              iVar15 = iVar17;
            } while (iVar8 < iVar2);
            iVar17 = iVar17 >> 1;
          }
          iVar15 = iVar10;
          if (((puVar3[iVar10] != uVar13) && (iVar15 = iVar2, uVar13 <= puVar3[iVar10])) &&
             (iVar15 = iVar10, iVar17 + iVar5 + 1 != iVar10)) {
            iVar17 = iVar17 + iVar5;
            do {
              iVar15 = iVar17 + iVar10 >> 1;
              if (puVar3[iVar15] == uVar13) break;
              iVar8 = iVar15;
              if (puVar3[iVar15] < uVar13) {
                iVar8 = iVar10;
                iVar17 = iVar15;
              }
              iVar15 = iVar8;
              iVar10 = iVar8;
            } while (iVar17 + 1 != iVar8);
          }
        }
        iVar8 = iVar15;
        if (iVar9 == iVar2) {
          return false;
        }
        if (iVar8 - iVar9 != uVar16) {
          return false;
        }
        if ((puVar3[iVar9] != uVar1) || (uVar14 != puVar3[iVar8])) goto LAB_0010ea2e;
        uVar12 = uVar12 + 1;
        bVar18 = uVar7 <= uVar12;
      } while (uVar12 != uVar7);
    }
  }
  return bVar18;
}

Assistant:

bool run_container_is_subset_array(const run_container_t* container1,
                                   const array_container_t* container2) {
    if (run_container_cardinality(container1) > container2->cardinality)
        return false;
    int32_t start_pos = -1, stop_pos = -1;
    for (int i = 0; i < container1->n_runs; ++i) {
        int32_t start = container1->runs[i].value;
        int32_t stop = start + container1->runs[i].length;
        start_pos = advanceUntil(container2->array, stop_pos,
                                 container2->cardinality, start);
        stop_pos = advanceUntil(container2->array, stop_pos,
                                container2->cardinality, stop);
        if (start_pos == container2->cardinality) {
            return false;
        } else if (stop_pos - start_pos != stop - start ||
                   container2->array[start_pos] != start ||
                   container2->array[stop_pos] != stop) {
            return false;
        }
    }
    return true;
}